

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Instructions.h
# Opt level: O3

int __thiscall
flow::UnaryInstr<(flow::UnaryOperator)3,_(flow::LiteralType)2>::clone
          (UnaryInstr<(flow::UnaryOperator)3,_(flow::LiteralType)2> *this,__fn *__fn,
          void *__child_stack,int __flags,void *__arg,...)

{
  Value *op;
  UnaryInstr<(flow::UnaryOperator)3,_(flow::LiteralType)2> *this_00;
  
  op = (Value *)**(undefined8 **)(__fn + 0x50);
  this_00 = (UnaryInstr<(flow::UnaryOperator)3,_(flow::LiteralType)2> *)operator_new(0x70);
  UnaryInstr(this_00,op,(string *)(__fn + 0x10));
  (this->super_Instr).super_Value._vptr_Value = (_func_int **)this_00;
  return (int)this;
}

Assistant:

std::unique_ptr<Instr> clone() override {
    return std::make_unique<UnaryInstr<Operator, ResultType>>(operand(0), name());
  }